

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O3

Cut_Man_t * Abc_NtkCuts(Abc_Ntk_t *pNtk,Cut_Params_t *pParams)

{
  size_t __size;
  Abc_Obj_t *pNode;
  int iVar1;
  uint uVar2;
  int iVar3;
  Cut_Man_t *p;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  ProgressBar *p_00;
  uint *puVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  Cut_Man_t *pCVar13;
  char *__assertion;
  Abc_Obj_t *pAVar14;
  int iVar15;
  Cut_Cut_t *pCut;
  timespec ts;
  long local_60;
  timespec local_50;
  int *local_40;
  ulong local_38;
  
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    local_60 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_60 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (pParams->fAdjust != 0) {
    Abc_NtkCutsSubtractFanunt(pNtk);
  }
  nEqual = 0;
  nGood = 0;
  nTotal = 0;
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCut.c"
                  ,0x8d,"Cut_Man_t *Abc_NtkCuts(Abc_Ntk_t *, Cut_Params_t *)");
  }
  pParams->nIdsMax = pNtk->vObjs->nSize;
  p = Cut_ManStart(pParams);
  if ((pParams->fGlobal == 0) && (pParams->fLocal == 0)) goto LAB_002a4353;
  pVVar6 = pNtk->vObjs;
  iVar1 = pVVar6->nSize;
  uVar12 = (ulong)iVar1;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar15 = (int)(uVar12 + 1);
  iVar3 = 0x10;
  if (0xe < uVar12) {
    iVar3 = iVar15;
  }
  pVVar4->nCap = iVar3;
  if (iVar3 == 0) {
    pVVar4->pArray = (int *)0x0;
    pVVar4->nSize = iVar15;
LAB_002a4226:
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar3 << 2);
    pVVar4->pArray = piVar5;
    pVVar4->nSize = iVar15;
    if (piVar5 == (int *)0x0) goto LAB_002a4226;
    memset(piVar5,0,(uVar12 + 1) * 4);
  }
  if (iVar1 < 1) {
    uVar11 = 0;
    uVar10 = 0;
  }
  else {
    lVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    local_40 = piVar5;
    local_38 = uVar12;
    do {
      pAVar14 = (Abc_Obj_t *)pVVar6->pArray[lVar9];
      if (pAVar14 != (Abc_Obj_t *)0x0) {
        uVar2 = *(uint *)&pAVar14->field_0x14;
        uVar8 = uVar2 & 0xf;
        if ((0xfffffffd < uVar8 - 5) &&
           (pNode = (Abc_Obj_t *)pAVar14->pNtk->vObjs->pArray[*(pAVar14->vFanins).pArray],
           (*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
          iVar1 = Abc_NodeMffcSize(pNode);
          uVar10 = uVar10 + iVar1;
          uVar2 = *(uint *)&pAVar14->field_0x14;
        }
        uVar11 = uVar11 + (uVar8 == 7);
        if ((((uVar2 & 0xf) == 7) && (1 < (pAVar14->vFanouts).nSize)) &&
           (iVar1 = Abc_NodeIsMuxControlType(pAVar14), iVar1 == 0)) {
          iVar1 = Abc_NodeMffcSize(pAVar14);
          iVar3 = Abc_NodeMffcSize(pAVar14);
          uVar10 = iVar3 + uVar10;
          if ((2 < iVar1) || (8 < (pAVar14->vFanouts).nSize)) {
            if ((uint)local_38 < (uint)pAVar14->Id) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            local_40[(uint)pAVar14->Id] = 1;
          }
        }
      }
      lVar9 = lVar9 + 1;
      pVVar6 = pNtk->vObjs;
    } while (lVar9 < pVVar6->nSize);
  }
  printf("Total nodes = %d. Total MFFC nodes = %d.\n",(ulong)uVar11,(ulong)uVar10);
  Cut_ManSetNodeAttrs(p,pVVar4);
LAB_002a4353:
  if (pParams->fDrop != 0) {
    pVVar4 = Abc_NtkFanoutCounts(pNtk);
    Cut_ManSetFanoutCounts(p,pVVar4);
  }
  pVVar6 = pNtk->vCis;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      if (0 < *(int *)((long)pVVar6->pArray[lVar9] + 0x2c)) {
        Cut_NodeSetTriv(p,*(int *)((long)pVVar6->pArray[lVar9] + 0x10));
        pVVar6 = pNtk->vCis;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar6->nSize);
  }
  pVVar6 = Abc_AigDfs(pNtk,0,1);
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  p_00 = Extra_ProgressBarStart(_stdout,pVVar6->nSize);
  if (pVVar6->nSize < 1) {
LAB_002a45ce:
    Extra_ProgressBarStop(p_00);
    if (pVVar6->pArray != (void **)0x0) {
      free(pVVar6->pArray);
    }
    free(pVVar6);
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
    }
    free(pVVar4);
    pCVar13 = p;
    Cut_ManPrintStats(p);
    Abc_Print((int)pCVar13,"%s =","TOTAL");
    iVar3 = 3;
    iVar1 = clock_gettime(3,&local_50);
    if (iVar1 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar9 + local_60) / 1000000.0);
    if (nTotal != 0) {
      printf("Total cuts = %d. Good cuts = %d.  Ratio = %5.2f\n",(double)nGood / (double)nTotal);
    }
    if (pParams->fAdjust != 0) {
      Abc_NtkCutsAddFanunt(pNtk);
    }
    return p;
  }
  lVar9 = 0;
LAB_002a43fe:
  pAVar14 = (Abc_Obj_t *)pVVar6->pArray[lVar9];
  if ((*(uint *)&pAVar14->field_0x14 & 0xf) - 5 < 0xfffffffe) {
    if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= lVar9)) {
      Extra_ProgressBarUpdate_int(p_00,(int)lVar9,(char *)0x0);
    }
    puVar7 = (uint *)Abc_NodeGetCuts(p,pAVar14,pParams->fDag,pParams->fTree);
    if (pParams->fNpnSave != 0) {
      for (; puVar7 != (uint *)0x0; puVar7 = *(uint **)(puVar7 + 4)) {
        uVar10 = *puVar7;
        if (0x3fffffff < uVar10) {
          Npn_ManSaveOne((uint *)((long)puVar7 + (ulong)(uVar10 >> 0x16 & 0x3c) + 0x18),
                         uVar10 >> 0x1c);
        }
      }
    }
    if (pParams->fDrop != 0) {
      Cut_NodeTryDroppingCuts(p,*(pAVar14->vFanins).pArray);
      Cut_NodeTryDroppingCuts(p,(pAVar14->vFanins).pArray[1]);
    }
    if (((ulong)pAVar14 & 1) != 0) {
      __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_002a470e:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                    ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
    }
    if (pAVar14->pNtk->ntkType != ABC_NTK_STRASH) {
      __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
      goto LAB_002a470e;
    }
    if (((pAVar14->field_5).pData != (void *)0x0) && (0 < (pAVar14->vFanouts).nSize)) {
      pVVar4->nSize = 0;
      iVar1 = 0;
      do {
        iVar3 = pAVar14->Id;
        if (iVar1 == pVVar4->nCap) {
          if (iVar1 < 0x10) {
            if (pVVar4->pArray == (int *)0x0) {
              piVar5 = (int *)malloc(0x40);
            }
            else {
              piVar5 = (int *)realloc(pVVar4->pArray,0x40);
            }
            pVVar4->pArray = piVar5;
            if (piVar5 == (int *)0x0) {
LAB_002a46df:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar4->nCap = 0x10;
          }
          else {
            __size = (ulong)(uint)(iVar1 * 2) * 4;
            if (pVVar4->pArray == (int *)0x0) {
              piVar5 = (int *)malloc(__size);
            }
            else {
              piVar5 = (int *)realloc(pVVar4->pArray,__size);
            }
            pVVar4->pArray = piVar5;
            if (piVar5 == (int *)0x0) goto LAB_002a46df;
            pVVar4->nCap = iVar1 * 2;
          }
        }
        else {
          piVar5 = pVVar4->pArray;
        }
        iVar1 = pVVar4->nSize;
        pVVar4->nSize = iVar1 + 1;
        piVar5[iVar1] = iVar3;
        pAVar14 = (Abc_Obj_t *)(pAVar14->field_5).pData;
        if (pAVar14 == (Abc_Obj_t *)0x0) goto LAB_002a45a8;
        iVar1 = pVVar4->nSize;
      } while( true );
    }
  }
  else if (pParams->fDrop != 0) {
    Cut_NodeTryDroppingCuts(p,*(pAVar14->vFanins).pArray);
  }
  goto LAB_002a45be;
LAB_002a45a8:
  Cut_NodeUnionCuts(p,pVVar4);
LAB_002a45be:
  lVar9 = lVar9 + 1;
  if (pVVar6->nSize <= lVar9) goto LAB_002a45ce;
  goto LAB_002a43fe;
}

Assistant:

Cut_Man_t * Abc_NtkCuts( Abc_Ntk_t * pNtk, Cut_Params_t * pParams )
{
    ProgressBar * pProgress;
    Cut_Man_t * p;
    Cut_Cut_t * pList;
    Abc_Obj_t * pObj, * pNode;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vChoices;
    int i;
    abctime clk = Abc_Clock();

    extern void Abc_NtkBalanceAttach( Abc_Ntk_t * pNtk );
    extern void Abc_NtkBalanceDetach( Abc_Ntk_t * pNtk );

    if ( pParams->fAdjust )
    Abc_NtkCutsSubtractFanunt( pNtk );

    nTotal = nGood = nEqual = 0;

    assert( Abc_NtkIsStrash(pNtk) );
    // start the manager
    pParams->nIdsMax = Abc_NtkObjNumMax( pNtk );
    p = Cut_ManStart( pParams );
    // compute node attributes if local or global cuts are requested
    if ( pParams->fGlobal || pParams->fLocal )
    {
        extern Vec_Int_t * Abc_NtkGetNodeAttributes( Abc_Ntk_t * pNtk );
        Cut_ManSetNodeAttrs( p, Abc_NtkGetNodeAttributes(pNtk) );
    }
    // prepare for cut dropping
    if ( pParams->fDrop )
        Cut_ManSetFanoutCounts( p, Abc_NtkFanoutCounts(pNtk) );
    // set cuts for PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) > 0 )
            Cut_NodeSetTriv( p, pObj->Id );
    // compute cuts for internal nodes
    vNodes = Abc_AigDfs( pNtk, 0, 1 ); // collects POs
    vChoices = Vec_IntAlloc( 100 );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(vNodes) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        // when we reached a CO, it is time to deallocate the cuts
        if ( Abc_ObjIsCo(pObj) )
        {
            if ( pParams->fDrop )
                Cut_NodeTryDroppingCuts( p, Abc_ObjFaninId0(pObj) );
            continue;
        }
        // skip constant node, it has no cuts
//        if ( Abc_NodeIsConst(pObj) )
//            continue;
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // compute the cuts to the internal node
        pList = (Cut_Cut_t *)Abc_NodeGetCuts( p, pObj, pParams->fDag, pParams->fTree );
        if ( pParams->fNpnSave && pList )
        {
            extern void Npn_ManSaveOne( unsigned * puTruth, int nVars );
            Cut_Cut_t * pCut;
            for ( pCut = pList; pCut; pCut = pCut->pNext )
                if ( pCut->nLeaves >= 4 )
                    Npn_ManSaveOne( Cut_CutReadTruth(pCut), pCut->nLeaves );
        }
        // consider dropping the fanins cuts
        if ( pParams->fDrop )
        {
            Cut_NodeTryDroppingCuts( p, Abc_ObjFaninId0(pObj) );
            Cut_NodeTryDroppingCuts( p, Abc_ObjFaninId1(pObj) );
        }
        // add cuts due to choices
        if ( Abc_AigNodeIsChoice(pObj) )
        {
            Vec_IntClear( vChoices );
            for ( pNode = pObj; pNode; pNode = (Abc_Obj_t *)pNode->pData )
                Vec_IntPush( vChoices, pNode->Id );
            Cut_NodeUnionCuts( p, vChoices );
        }
    }
    Extra_ProgressBarStop( pProgress );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vChoices );
    Cut_ManPrintStats( p );
ABC_PRT( "TOTAL", Abc_Clock() - clk );
//    printf( "Area = %d.\n", Abc_NtkComputeArea( pNtk, p ) );
//Abc_NtkPrintCuts( p, pNtk, 0 );
//    Cut_ManPrintStatsToFile( p, pNtk->pSpec, Abc_Clock() - clk );

    // temporary printout of stats
    if ( nTotal )
    printf( "Total cuts = %d. Good cuts = %d.  Ratio = %5.2f\n", nTotal, nGood, ((double)nGood)/nTotal );
    if ( pParams->fAdjust )
    Abc_NtkCutsAddFanunt( pNtk );
    return p;
}